

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

bool __thiscall soul::AST::ArrayElementRef::isSliceRangeValid(ArrayElementRef *this)

{
  Expression *pEVar1;
  bool bVar2;
  int iVar3;
  int64_t start;
  int64_t end;
  Type type;
  pool_ptr<soul::AST::Constant> c;
  Type local_40;
  long local_28;
  
  if (((((this->isSlice != true) || (pEVar1 = (this->object).object, pEVar1 == (Expression *)0x0))
       || (pEVar1->kind != value)) ||
      ((iVar3 = (*(pEVar1->super_Statement).super_ASTObject._vptr_ASTObject[3])(),
       (char)iVar3 == '\0' || (pEVar1 = (this->startIndex).object, pEVar1 == (Expression *)0x0))))
     || ((pEVar1->kind != value ||
         (iVar3 = (*(pEVar1->super_Statement).super_ASTObject._vptr_ASTObject[3])(),
         (char)iVar3 == '\0')))) {
    return false;
  }
  pEVar1 = (this->startIndex).object;
  if (pEVar1 != (Expression *)0x0) {
    (*(pEVar1->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_28);
    if (local_28 == 0) {
      return false;
    }
    soul::Value::getData((PackedData *)&local_40,(Value *)(local_28 + 0x30));
    start = soul::Value::PackedData::getAsInt64((PackedData *)&local_40);
    pEVar1 = (this->endIndex).object;
    if (pEVar1 == (Expression *)0x0) {
      pEVar1 = (this->object).object;
      if (pEVar1 == (Expression *)0x0) goto LAB_001dca07;
      (*(pEVar1->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_40);
      if ((local_40.category & ~primitive) != vector) {
        throwInternalCompilerError("isArrayOrVector()","getArrayOrVectorSize",0x137);
      }
      end = (int64_t)local_40.boundingSize;
      RefCountedPtr<soul::Structure>::decIfNotNull(local_40.structure.object);
    }
    else {
      iVar3 = (*(pEVar1->super_Statement).super_ASTObject._vptr_ASTObject[3])();
      if ((char)iVar3 == '\0') {
        return false;
      }
      pEVar1 = (this->endIndex).object;
      if (((pEVar1 == (Expression *)0x0) || (pEVar1->kind != value)) ||
         (iVar3 = (*(pEVar1->super_Statement).super_ASTObject._vptr_ASTObject[3])(),
         (char)iVar3 == '\0')) {
        throwInternalCompilerError("isResolvedAsValue (endIndex)","isSliceRangeValid",0x9c9);
      }
      pEVar1 = (this->endIndex).object;
      if (pEVar1 == (Expression *)0x0) goto LAB_001dca07;
      (*(pEVar1->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_28);
      if (local_28 == 0) {
        return false;
      }
      soul::Value::getData((PackedData *)&local_40,(Value *)(local_28 + 0x30));
      end = soul::Value::PackedData::getAsInt64((PackedData *)&local_40);
    }
    pEVar1 = (this->object).object;
    if (pEVar1 != (Expression *)0x0) {
      (*(pEVar1->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_40);
      if ((local_40.category & ~primitive) == vector) {
        bVar2 = Type::isValidArrayOrVectorRange<long>(&local_40,start,end);
      }
      else {
        bVar2 = false;
      }
      RefCountedPtr<soul::Structure>::decIfNotNull(local_40.structure.object);
      return bVar2;
    }
  }
LAB_001dca07:
  throwInternalCompilerError("object != nullptr","operator->",0x3c);
}

Assistant:

bool isSliceRangeValid() const
        {
            if (isSlice && isResolvedAsValue (object) && isResolvedAsValue (startIndex))
            {
                int64_t start = 0, end = 0;

                if (auto c = startIndex->getAsConstant())
                    start = c->value.getAsInt64();
                else
                    return false;

                if (endIndex == nullptr)
                {
                    end = (int64_t) object->getResultType().getArrayOrVectorSize();
                }
                else
                {
                    if (! endIndex->isResolved())
                        return false;

                    SOUL_ASSERT (isResolvedAsValue (endIndex));

                    if (auto c = endIndex->getAsConstant())
                        end = c->value.getAsInt64();
                    else
                        return false;
                }

                auto type = object->getResultType();
                return type.isArrayOrVector() && type.isValidArrayOrVectorRange (start, end);
            }

            return false;
        }